

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O1

int coda_get_header_buf(coda_header_t *header,char *s,size_t len)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  bool bVar6;
  string key;
  key_type local_50;
  
  if (s == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar5 = s + len;
    do {
      if (pcVar5 <= s) break;
      pcVar2 = coda_strnstr(s,"\r\n",(long)pcVar5 - (long)s);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = pcVar5;
      }
      pcVar3 = s;
      if (pcVar2 != s) {
        pcVar3 = coda_strnchr(s,':',(long)pcVar5 - (long)s);
        if (pcVar3 < pcVar2 && pcVar3 != (char *)0x0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,s,pcVar3);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](header,&local_50);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)(pcVar3 + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        pcVar3 = pcVar2 + 2;
      }
      bVar6 = pcVar2 != s;
      s = pcVar3;
    } while (bVar6);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_get_header_buf(coda_header_t& header, const char* s, size_t len)
{
	if (!s) return -1;

	const char* e = s + len;

	while (s < e)
	{
		const char* crlf = coda_strnstr(s, "\r\n", e - s);
		if (NULL == crlf) crlf = e;
		if (crlf == s) break; /* \r\n\r\n situation, end of headers */

		const char* dodo = coda_strnchr(s, ':', e - s);
		if (NULL != dodo && dodo < crlf)
		{
			std::string key (s, dodo - s);
			header[key].assign(dodo + 1, crlf - dodo - 1);
		}

		s = crlf + 2;
	}

	return 0;
}